

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ModuleCloner.h
# Opt level: O0

void __thiscall soul::ModuleCloner::populateClonedStruct(ModuleCloner *this,Structure *old)

{
  mapped_type *this_00;
  Structure *this_01;
  Type local_58;
  Member *local_40;
  Member *m;
  Member *__end2;
  Member *__begin2;
  ArrayWithPreallocation<soul::Structure::Member,_8UL> *local_20;
  ArrayWithPreallocation<soul::Structure::Member,_8UL> *__range2;
  Structure *old_local;
  ModuleCloner *this_local;
  
  __begin2 = (Member *)old;
  __range2 = (ArrayWithPreallocation<soul::Structure::Member,_8UL> *)old;
  old_local = (Structure *)this;
  this_00 = std::
            unordered_map<const_soul::Structure_*,_soul::RefCountedPtr<soul::Structure>,_std::hash<const_soul::Structure_*>,_std::equal_to<const_soul::Structure_*>,_std::allocator<std::pair<const_soul::Structure_*const,_soul::RefCountedPtr<soul::Structure>_>_>_>
            ::operator[](this->structMappings,(key_type *)&__begin2);
  this_01 = RefCountedPtr<soul::Structure>::operator->(this_00);
  local_20 = Structure::getMembers(this_01);
  __end2 = ArrayWithPreallocation<soul::Structure::Member,_8UL>::begin(local_20);
  m = ArrayWithPreallocation<soul::Structure::Member,_8UL>::end(local_20);
  for (; __end2 != m; __end2 = __end2 + 1) {
    local_40 = __end2;
    cloneType(&local_58,this,&__end2->type);
    Type::operator=(&local_40->type,&local_58);
    Type::~Type(&local_58);
  }
  return;
}

Assistant:

void populateClonedStruct (const Structure& old)
    {
        for (auto& m : structMappings[std::addressof (old)]->getMembers())
            m.type = cloneType (m.type);
    }